

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BVIndex __thiscall BVStatic<2048UL>::Count(BVStatic<2048UL> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = 0;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 8) {
    BVar3 = BVUnitT<unsigned_long>::Count
                      ((BVUnitT<unsigned_long> *)((long)&this->data[0].word + lVar6));
    uVar5 = uVar5 + BVar3;
  }
  if (0x800 < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x1f6,"(sum <= bitCount)","sum <= bitCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return uVar5;
}

Assistant:

BVIndex Count() const
    {
        BVIndex sum = 0;
        for (BVIndex i = 0; i < wordCount; i++)
        {
            sum += this->data[i].Count();
        }

        Assert(sum <= bitCount);
        return sum;
    }